

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_lite.h
# Opt level: O3

void __thiscall
google::protobuf::internal::MapFieldLite<int,_int>::~MapFieldLite(MapFieldLite<int,_int> *this)

{
  void *v1;
  Nonnull<const_char_*> failure_msg;
  undefined1 local_28 [16];
  NodeBase **local_18;
  Arena *local_10;
  
  v1 = *(void **)((long)&this->field_0 + 0x18);
  if (v1 == (void *)0x0) {
    local_28._0_8_ = *(undefined8 *)&this->field_0;
    local_28._8_8_ =
         *(undefined8 *)
          &(this->field_0).map_.super_KeyMapBase<unsigned_int>.super_UntypedMapBase.
           index_of_first_non_null_;
    *(undefined8 *)&this->field_0 = 0x100000000;
    *(undefined8 *)((long)&this->field_0 + 8) = 0x110c001000000001;
    local_18 = *(NodeBase ***)((long)&this->field_0 + 0x10);
    *(undefined8 **)((long)&this->field_0 + 0x10) = &kGlobalEmptyTable;
    local_10 = (Arena *)0x0;
    Map<int,_int>::~Map((Map<int,_int> *)local_28);
    return;
  }
  failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                          (v1,(void *)0x0,"map_.arena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field_lite.h"
             ,0x37,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

~MapFieldLite() {
    ABSL_DCHECK_EQ(map_.arena(), nullptr);
    // We want to destruct the map in such a way that we can verify
    // that we've done that, but also be sure that we've deallocated
    // everything (as opposed to leaving an allocation behind with no
    // data in it, as would happen if a vector was resize'd to zero.
    // Map::Swap with an empty map accomplishes that.
    decltype(map_) swapped_map(map_.arena());
    map_.InternalSwap(&swapped_map);
  }